

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTransaction::SetIssuance
          (ConfidentialTransaction *this,uint32_t tx_in_index,ByteData256 *blinding_nonce,
          ByteData256 *asset_entropy,ConfidentialValue *issuance_amount,
          ConfidentialValue *inflation_keys,ByteData *issuance_amount_rangeproof,
          ByteData *inflation_keys_rangeproof)

{
  pointer puVar1;
  uchar *puVar2;
  size_type sVar3;
  uchar *puVar4;
  size_type sVar5;
  uchar *puVar6;
  size_type sVar7;
  uchar *puVar8;
  size_type sVar9;
  uchar *puVar10;
  size_type sVar11;
  uchar *puVar12;
  size_type sVar13;
  CfdException *this_00;
  reference this_01;
  ulong uVar14;
  allocator local_1a9;
  string local_1a8;
  CfdSourceLocation local_188;
  int local_16c;
  undefined1 local_168 [4];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_150;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *inflation_keys_rangeproof_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_130;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *issuance_amount_rangeproof_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_110;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *inflation_keys_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *issuance_amount_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *entropy;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *nonce;
  wally_tx *tx_pointer;
  ConfidentialValue *inflation_keys_local;
  ConfidentialValue *issuance_amount_local;
  ByteData256 *asset_entropy_local;
  ByteData256 *blinding_nonce_local;
  ConfidentialTransaction *pCStack_38;
  uint32_t tx_in_index_local;
  ConfidentialTransaction *this_local;
  
  tx_pointer = (wally_tx *)inflation_keys;
  inflation_keys_local = issuance_amount;
  issuance_amount_local = (ConfidentialValue *)asset_entropy;
  asset_entropy_local = blinding_nonce;
  blinding_nonce_local._4_4_ = tx_in_index;
  pCStack_38 = this;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0x66f,"SetIssuance");
  nonce = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
          (this->super_AbstractTransaction).wally_tx_pointer_;
  ByteData256::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&entropy,blinding_nonce);
  local_70 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&entropy;
  ByteData256::GetBytes(&local_a8,asset_entropy);
  local_90 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8;
  ConfidentialValue::GetData((ByteData *)&inflation_keys_bytes,issuance_amount);
  ByteData::GetBytes(&local_d8,(ByteData *)&inflation_keys_bytes);
  ByteData::~ByteData((ByteData *)&inflation_keys_bytes);
  local_c0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8;
  ConfidentialValue::GetData((ByteData *)&issuance_amount_rangeproof_bytes,inflation_keys);
  ByteData::GetBytes(&local_110,(ByteData *)&issuance_amount_rangeproof_bytes);
  ByteData::~ByteData((ByteData *)&issuance_amount_rangeproof_bytes);
  local_f8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_110;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &inflation_keys_rangeproof_bytes,issuance_amount_rangeproof);
  local_130 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
              &inflation_keys_rangeproof_bytes;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_168,
                     inflation_keys_rangeproof);
  local_150 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_168;
  puVar1 = (nonce->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar14 = (ulong)blinding_nonce_local._4_4_;
  puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_70);
  sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_70);
  puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_90);
  sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_90);
  puVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_c0);
  sVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_c0);
  puVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_f8);
  sVar9 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_f8);
  puVar10 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_130);
  sVar11 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_130);
  puVar12 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_150);
  sVar13 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_150);
  local_16c = wally_tx_elements_input_issuance_set
                        (puVar1 + uVar14 * 0xd0,puVar2,sVar3,puVar4,sVar5,puVar6,sVar7,puVar8,sVar9,
                         puVar10,sVar11,puVar12,sVar13);
  if (local_16c != 0) {
    local_188.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_188.filename = local_188.filename + 1;
    local_188.line = 0x687;
    local_188.funcname = "SetIssuance";
    logger::warn<int&>(&local_188,"wally_tx_elements_input_issuance_set NG[{}].",&local_16c);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_1a8,"txin add error.",&local_1a9);
    CfdException::CfdException(this_00,kCfdIllegalStateError,&local_1a8);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  SetElementsTxState(this);
  this_01 = ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
            ::operator[](&this->vin_,(ulong)blinding_nonce_local._4_4_);
  ConfidentialTxIn::SetIssuance
            (this_01,blinding_nonce,asset_entropy,issuance_amount,inflation_keys,
             issuance_amount_rangeproof,inflation_keys_rangeproof);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_168);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &inflation_keys_rangeproof_bytes);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_110);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&entropy);
  return;
}

Assistant:

void ConfidentialTransaction::SetIssuance(
    // force LF
    uint32_t tx_in_index, const ByteData256 blinding_nonce,
    const ByteData256 asset_entropy, const ConfidentialValue issuance_amount,
    const ConfidentialValue inflation_keys,
    const ByteData issuance_amount_rangeproof,
    const ByteData inflation_keys_rangeproof) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  const std::vector<uint8_t> &nonce = blinding_nonce.GetBytes();
  const std::vector<uint8_t> &entropy = asset_entropy.GetBytes();
  const std::vector<uint8_t> &issuance_amount_bytes =
      issuance_amount.GetData().GetBytes();
  const std::vector<uint8_t> &inflation_keys_bytes =
      inflation_keys.GetData().GetBytes();
  const std::vector<uint8_t> &issuance_amount_rangeproof_bytes =
      issuance_amount_rangeproof.GetBytes();
  const std::vector<uint8_t> &inflation_keys_rangeproof_bytes =
      inflation_keys_rangeproof.GetBytes();

  int ret = wally_tx_elements_input_issuance_set(
      &tx_pointer->inputs[tx_in_index], nonce.data(), nonce.size(),
      entropy.data(), entropy.size(), issuance_amount_bytes.data(),
      issuance_amount_bytes.size(), inflation_keys_bytes.data(),
      inflation_keys_bytes.size(), issuance_amount_rangeproof_bytes.data(),
      issuance_amount_rangeproof_bytes.size(),
      inflation_keys_rangeproof_bytes.data(),
      inflation_keys_rangeproof_bytes.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_elements_input_issuance_set NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "txin add error.");
  }
  SetElementsTxState();

  vin_[tx_in_index].SetIssuance(
      blinding_nonce, asset_entropy, issuance_amount, inflation_keys,
      issuance_amount_rangeproof, inflation_keys_rangeproof);
}